

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<true,_true,_false>::pack_bc(DaTrie<true,_true,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  reference pvVar4;
  DaTrie<true,_true,_false> *in_RDI;
  Edge *unaff_retaddr;
  uint32_t in_stack_0000000c;
  DaTrie<true,_true,_false> *in_stack_00000010;
  uint32_t base;
  uint32_t i;
  uint32_t max_pos;
  uint32_t in_stack_00000038;
  uint32_t in_stack_0000003c;
  Edge edge;
  Query query;
  uint32_t in_stack_fffffffffffffec0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffecc;
  Edge *in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffedc;
  DaTrie<true,_true,_false> *in_stack_fffffffffffffee0;
  Query local_20;
  DaTrie<true,_true,_false> *query_00;
  
  query_00 = in_RDI;
  Query::Query(&local_20);
  Edge::Edge((Edge *)&stack0xfffffffffffffed8);
  while (uVar2 = bc_emps(in_RDI), 0xff < uVar2) {
    uVar3 = bc_size((DaTrie<true,_true,_false> *)0x178922);
    for (uVar5 = 0; uVar5 < 0x100; uVar5 = uVar5 + 1) {
      uVar3 = uVar3 - 1;
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3)
      ;
      bVar1 = Bc::is_fixed(pvVar4);
      if (bVar1) break;
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    bVar1 = Bc::is_fixed(pvVar4);
    if (!bVar1) {
      __assert_fail("bc_[max_pos].is_fixed()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                    ,0xba,
                    "void ddd::DaTrie<true, true, false>::pack_bc() [WithBLM = true, WithNLM = true, Prefix = false]"
                   );
    }
    pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar3);
    uVar2 = Bc::check(pvVar4);
    Query::set_node_pos(&local_20,uVar2);
    Query::node_pos(&local_20);
    edge_(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
          CONCAT44(in_stack_fffffffffffffecc,uVar3));
    in_stack_fffffffffffffec0 =
         excheck_((DaTrie<true,_true,_false> *)CONCAT44(in_stack_fffffffffffffecc,uVar3),
                  (Edge *)CONCAT44(uVar5,in_stack_fffffffffffffec0),
                  (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_RDI);
    if (in_stack_fffffffffffffec0 == 0xffffffff) break;
    shelter_(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(Query *)query_00);
    Query::node_pos(&local_20);
    move_((DaTrie<true,_true,_false> *)edge.labels_._0_8_,in_stack_0000003c,in_stack_00000038,
          _max_pos,_base);
  }
  Edge::~Edge((Edge *)&stack0xfffffffffffffed8);
  Query::~Query(&local_20);
  return;
}

Assistant:

void pack_bc() {
    assert(!Prefix);

    Query query;
    Edge edge;

    while (BLOCK_SIZE <= bc_emps()) {
      auto max_pos = bc_size();
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        if (bc_[--max_pos].is_fixed()) {
          break;
        }
      }
      assert(bc_[max_pos].is_fixed());

      query.set_node_pos(bc_[max_pos].check());
      edge_(query.node_pos(), edge);

      auto base = excheck_(edge, blocks_);
      if (base == NOT_FOUND) {
        break;
      }

      shelter_(base, edge, query);
      move_(query.node_pos(), base, edge, query);
    }
  }